

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_dcbz(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 EA;
  TCGv_i32 pTVar1;
  uintptr_t o;
  uintptr_t o_1;
  TCGTemp *local_38;
  TCGTemp *local_30;
  TCGTemp *local_28;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  gen_set_access_type(ctx,0x60);
  EA = tcg_temp_new_i64(tcg_ctx);
  pTVar1 = tcg_const_i32_ppc64(tcg_ctx,ctx->opcode & 0x3ff000);
  gen_addr_reg_index(ctx,EA);
  local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_30 = (TCGTemp *)(EA + (long)tcg_ctx);
  local_28 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  tcg_gen_callN_ppc64(tcg_ctx,helper_dcbz_ppc64,(TCGTemp *)0x0,3,&local_38);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(EA + (long)tcg_ctx));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_dcbz(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv tcgv_addr;
    TCGv_i32 tcgv_op;

    gen_set_access_type(ctx, ACCESS_CACHE);
    tcgv_addr = tcg_temp_new(tcg_ctx);
    tcgv_op = tcg_const_i32(tcg_ctx, ctx->opcode & 0x03FF000);
    gen_addr_reg_index(ctx, tcgv_addr);
    gen_helper_dcbz(tcg_ctx, tcg_ctx->cpu_env, tcgv_addr, tcgv_op);
    tcg_temp_free(tcg_ctx, tcgv_addr);
    tcg_temp_free_i32(tcg_ctx, tcgv_op);
}